

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

MockSpec<void_(const_int_&)> * __thiscall
testing::internal::FunctionMocker<void_(const_int_&)>::With
          (MockSpec<void_(const_int_&)> *__return_storage_ptr__,
          FunctionMocker<void_(const_int_&)> *this,Matcher<const_int_&> *m)

{
  MatcherBase<const_int_&> local_20;
  
  local_20.vtable_ = (m->super_MatcherBase<const_int_&>).vtable_;
  local_20.buffer_ = (m->super_MatcherBase<const_int_&>).buffer_;
  (m->super_MatcherBase<const_int_&>).vtable_ = (VTable *)0x0;
  local_20.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_0018a3f8;
  __return_storage_ptr__->function_mocker_ = this;
  Matcher<const_int_&>::Matcher
            ((Matcher<const_int_&> *)&__return_storage_ptr__->matchers_,
             (Matcher<const_int_&> *)&local_20);
  MatcherBase<const_int_&>::~MatcherBase(&local_20);
  return __return_storage_ptr__;
}

Assistant:

MockSpec<F> With(Matcher<Args>... m) {
    return MockSpec<F>(this, ::std::make_tuple(std::move(m)...));
  }